

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_from_signed62(secp256k1_scalar *r,secp256k1_modinv64_signed62 *a)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int64_t iVar5;
  int64_t iVar6;
  ulong uVar7;
  uint uVar8;
  secp256k1_modinv64_signed62 *in_RCX;
  ulong uVar9;
  secp256k1_modinv64_signed62 *psVar10;
  long lVar11;
  ulong uVar12;
  ulong *extraout_RDX;
  long lVar13;
  long lVar14;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_00;
  long lVar15;
  long lVar16;
  secp256k1_modinv64_signed62 *b;
  undefined8 unaff_RBX;
  secp256k1_modinv64_signed62 *psVar17;
  secp256k1_modinv64_signed62 *psVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int64_t *piVar22;
  int64_t *a_01;
  secp256k1_modinv64_signed62 *a_02;
  ulong uVar23;
  long lVar24;
  int64_t *piVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int64_t *piVar31;
  int64_t *a_03;
  bool bVar32;
  secp256k1_modinv64_signed62 sStack_128;
  secp256k1_modinv64_signed62 sStack_100;
  secp256k1_modinv64_signed62 *psStack_d8;
  int64_t *piStack_d0;
  int64_t *piStack_c8;
  ulong uStack_c0;
  int64_t *piStack_b8;
  ulong uStack_b0;
  int64_t *piStack_a8;
  secp256k1_modinv64_signed62 *psStack_a0;
  long lStack_98;
  int64_t *piStack_90;
  int64_t *piStack_88;
  secp256k1_modinv64_signed62 *psStack_80;
  long lStack_78;
  secp256k1_modinv64_signed62 *psStack_70;
  secp256k1_modinv64_signed62 *psStack_68;
  secp256k1_modinv64_signed62 *psStack_60;
  secp256k1_modinv64_signed62 *psStack_58;
  long lStack_50;
  int64_t *piStack_48;
  int64_t *piStack_40;
  undefined8 uStack_38;
  
  if ((ulong)a->v[0] >> 0x3e == 0) {
    uVar9 = a->v[1];
    if (0x3fffffffffffffff < uVar9) goto LAB_00146a68;
    uVar21 = a->v[2];
    if (0x3fffffffffffffff < uVar21) goto LAB_00146a6d;
    uVar7 = a->v[3];
    if (0x3fffffffffffffff < uVar7) goto LAB_00146a72;
    in_RCX = (secp256k1_modinv64_signed62 *)a->v[4];
    if ((secp256k1_modinv64_signed62 *)0xff < in_RCX) goto LAB_00146a77;
    uVar4 = uVar9 << 0x3e | a->v[0];
    uVar12 = uVar21 << 0x3c | uVar9 >> 2;
    uVar21 = uVar7 << 0x3a | uVar21 >> 4;
    uVar9 = (long)in_RCX << 0x38 | uVar7 >> 6;
    unaff_RBX = CONCAT71((int7)((ulong)unaff_RBX >> 8),0xbaaedce6af48a03a < uVar12);
    r->d[0] = uVar4;
    r->d[1] = uVar12;
    r->d[2] = uVar21;
    r->d[3] = uVar9;
    uVar3 = (uint)((0xfffffffffffffffd < uVar21 && uVar9 == 0xffffffffffffffff) &&
                  0xbaaedce6af48a03a < uVar12);
    uVar20 = 0;
    if (0xbaaedce6af48a03b < uVar12) {
      uVar20 = uVar3;
    }
    uVar20 = uVar20 | (uVar21 == 0xffffffffffffffff && uVar9 == 0xffffffffffffffff);
    a = (secp256k1_modinv64_signed62 *)(ulong)uVar20;
    r = (secp256k1_scalar *)0xbfd25e8cd0364140;
    uVar8 = 0;
    if (0xbfd25e8cd0364140 < uVar4) {
      uVar8 = uVar3;
    }
    uVar8 = uVar8 | uVar20;
    in_RCX = (secp256k1_modinv64_signed62 *)(ulong)uVar8;
    if (uVar8 == 0) {
      return;
    }
  }
  else {
    secp256k1_scalar_from_signed62_cold_6();
LAB_00146a68:
    secp256k1_scalar_from_signed62_cold_5();
LAB_00146a6d:
    secp256k1_scalar_from_signed62_cold_4();
LAB_00146a72:
    secp256k1_scalar_from_signed62_cold_3();
LAB_00146a77:
    secp256k1_scalar_from_signed62_cold_2();
  }
  secp256k1_scalar_from_signed62_cold_1();
  lVar27 = *(long *)r;
  piStack_48 = *(int64_t **)((long)r + 8);
  psStack_58 = *(secp256k1_modinv64_signed62 **)((long)r + 0x10);
  lStack_78 = *(long *)((long)r + 0x18);
  psStack_68 = *(secp256k1_modinv64_signed62 **)((long)r + 0x20);
  piVar31 = *(int64_t **)a;
  piStack_40 = *(int64_t **)((long)a + 8);
  lStack_50 = *(long *)((long)a + 0x10);
  uStack_b0 = *extraout_RDX;
  piStack_a8 = (int64_t *)extraout_RDX[1];
  uStack_c0 = extraout_RDX[2];
  piStack_b8 = (int64_t *)extraout_RDX[3];
  psVar17 = *(secp256k1_modinv64_signed62 **)((long)a + 0x18);
  psStack_70 = *(secp256k1_modinv64_signed62 **)((long)a + 0x20);
  piVar22 = (int64_t *)0x5;
  psVar10 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  piStack_c8 = (int64_t *)0x146b1d;
  a_01 = (int64_t *)r;
  uStack_38 = unaff_RBX;
  iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,-2);
  if (iVar2 < 1) {
    piStack_c8 = (int64_t *)0x14763d;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014763d:
    piStack_c8 = (int64_t *)0x147642;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00147642:
    piStack_c8 = (int64_t *)0x147647;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00147647:
    piStack_c8 = (int64_t *)0x14764c;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014764c:
    piStack_c8 = (int64_t *)0x147651;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_00147651:
    piStack_c8 = (int64_t *)0x147656;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00147656:
    piStack_c8 = (int64_t *)0x14765b;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0014765b:
    piStack_c8 = (int64_t *)0x147660;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar17 = in_RCX;
LAB_00147660:
    piStack_c8 = (int64_t *)0x147665;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00147665:
    piStack_c8 = (int64_t *)0x14766a;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0014766a:
    piStack_c8 = (int64_t *)0x14766f;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar18 = psVar17;
LAB_0014766f:
    piStack_c8 = (int64_t *)0x147674;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00147674:
    piStack_c8 = (int64_t *)0x147679;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00147679:
    piStack_c8 = (int64_t *)0x14767e;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0014767e:
    piStack_c8 = (int64_t *)0x147683;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00147683:
    piStack_c8 = (int64_t *)0x147688;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00147688:
    piStack_c8 = (int64_t *)0x14768d;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_0014768d:
    piStack_c8 = (int64_t *)0x147692;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00147692:
    piStack_c8 = (int64_t *)0x147697;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00147697:
    piStack_c8 = (int64_t *)0x14769c;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_0014769c:
    piStack_c8 = (int64_t *)0x1476a1;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_001476a1:
    a_03 = piVar31;
    a = (secp256k1_modinv64_signed62 *)r;
    piStack_c8 = (int64_t *)0x1476a6;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_001476a6:
    piStack_c8 = (int64_t *)0x1476ab;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_001476ab:
    piStack_c8 = (int64_t *)0x1476b0;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_001476b0:
    piStack_c8 = (int64_t *)0x1476b5;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_001476b5:
    piStack_c8 = (int64_t *)0x1476ba;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_001476ba:
    piStack_c8 = (int64_t *)0x1476bf;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_001476bf:
    piStack_c8 = (int64_t *)0x1476c4;
    secp256k1_modinv64_update_de_62_cold_23();
    r = (secp256k1_scalar *)a;
    piVar25 = a_03;
LAB_001476c4:
    piStack_c8 = (int64_t *)0x1476c9;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_001476c9:
    piStack_c8 = (int64_t *)0x1476ce;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001476ce:
    piStack_c8 = (int64_t *)0x1476d3;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001476d3:
    psVar17 = psVar10;
    piStack_c8 = (int64_t *)0x1476d8;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001476d8:
    uVar3 = (uint)piVar22;
    piStack_c8 = (int64_t *)0x1476dd;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar10 = (secp256k1_modinv64_signed62 *)0x1;
    piVar22 = (int64_t *)0x5;
    piStack_c8 = (int64_t *)0x146b3a;
    a_01 = (int64_t *)r;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)r,5,in_RCX,1);
    if (-1 < iVar2) goto LAB_0014763d;
    piVar22 = (int64_t *)0x5;
    psVar10 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    piStack_c8 = (int64_t *)0x146b59;
    a_01 = a->v;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,-2);
    if (iVar2 < 1) goto LAB_00147642;
    psVar10 = (secp256k1_modinv64_signed62 *)0x1;
    piVar22 = (int64_t *)0x5;
    piStack_c8 = (int64_t *)0x146b76;
    a_01 = a->v;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,1);
    if (-1 < iVar2) goto LAB_00147647;
    piStack_c8 = (int64_t *)0x146b9c;
    piStack_88 = (int64_t *)r;
    psStack_60 = psVar17;
    iVar5 = secp256k1_modinv64_abs(uStack_b0);
    piStack_c8 = (int64_t *)0x146ba9;
    a_01 = piStack_a8;
    iVar6 = secp256k1_modinv64_abs((int64_t)piStack_a8);
    psVar10 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar6);
    r = (secp256k1_scalar *)(int64_t *)0x3fffffffffffffff;
    if ((long)psVar10 < iVar5) goto LAB_0014764c;
    piStack_c8 = (int64_t *)0x146bc4;
    iVar5 = secp256k1_modinv64_abs(uStack_c0);
    piStack_c8 = (int64_t *)0x146bd1;
    a_01 = piStack_b8;
    iVar6 = secp256k1_modinv64_abs((int64_t)piStack_b8);
    a_03 = piStack_88;
    psVar10 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar6);
    if ((long)psVar10 < iVar5) goto LAB_00147651;
    r = (secp256k1_scalar *)0x7fffffffffffffff;
    piVar22 = (int64_t *)(uStack_b0 * lVar27);
    psVar10 = SUB168(SEXT816((long)uStack_b0) * SEXT816(lVar27),8);
    uVar9 = (long)piStack_a8 * (long)piVar31;
    lVar13 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)piVar31),8);
    lVar11 = (0x7fffffffffffffff - lVar13) - (long)psVar10;
    if (-1 < lVar13 &&
        (SBORROW8(0x7fffffffffffffff - lVar13,(long)psVar10) !=
        SBORROW8(lVar11,(ulong)((undefined1 *)~uVar9 < piVar22))) !=
        (long)(lVar11 - (ulong)((undefined1 *)~uVar9 < piVar22)) < 0) goto LAB_00147656;
    piVar25 = (int64_t *)(uVar9 + (long)piVar22);
    lVar26 = (long)psVar10->v + (ulong)CARRY8(uVar9,(ulong)piVar22) + lVar13;
    uVar21 = uStack_c0 * lVar27;
    lVar13 = SUB168(SEXT816((long)uStack_c0) * SEXT816(lVar27),8);
    uVar7 = (long)piStack_b8 * (long)piVar31;
    lVar14 = SUB168(SEXT816((long)piStack_b8) * SEXT816((long)piVar31),8);
    uVar9 = (ulong)(-uVar7 - 1 < uVar21);
    lVar27 = (0x7fffffffffffffff - lVar14) - lVar13;
    lVar11 = lVar27 - uVar9;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar14,lVar13) != SBORROW8(lVar27,uVar9)) == lVar11 < 0;
    psVar10 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)((ulong)lVar11 >> 8),lVar14 < 0 || bVar32);
    if (lVar14 >= 0 && !bVar32) goto LAB_0014765b;
    psVar17 = (secp256k1_modinv64_signed62 *)((long)psStack_70 >> 0x3f);
    lStack_98 = ((ulong)piStack_a8 & (ulong)psVar17) + (uStack_b0 & (long)psStack_68 >> 0x3f);
    uVar4 = uVar7 + uVar21;
    a_01 = (int64_t *)(lVar14 + lVar13 + (ulong)CARRY8(uVar7,uVar21));
    lVar27 = in_RCX->v[0];
    piVar22 = (int64_t *)in_RCX[1].v[0];
    psVar10 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    lStack_98 = lStack_98 - ((long)piVar22 * (long)piVar25 + lStack_98 & 0x3fffffffffffffffU);
    uVar21 = lStack_98 * lVar27;
    lVar13 = SUB168(SEXT816(lStack_98) * SEXT816(lVar27),8);
    uVar9 = (ulong)((undefined1 *)(-uVar21 - 1) < piVar25);
    lVar11 = (0x7fffffffffffffff - lVar13) - lVar26;
    piVar31 = (int64_t *)((-0x8000000000000000 - lVar13) - (ulong)(uVar21 != 0));
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar26) != SBORROW8(lVar11,uVar9)) ==
             (long)(lVar11 - uVar9) < 0;
    if (lVar13 < 0) {
      bVar32 = (SBORROW8(lVar26,(long)piVar31) !=
               SBORROW8(lVar26 - (long)piVar31,(ulong)(piVar25 < (undefined1 *)-uVar21))) ==
               (long)((lVar26 - (long)piVar31) - (ulong)(piVar25 < (undefined1 *)-uVar21)) < 0;
    }
    piStack_90 = a->v;
    psStack_80 = in_RCX;
    if (!bVar32) goto LAB_00147660;
    lVar11 = ((ulong)psVar17 & (ulong)piStack_b8) + ((long)psStack_68 >> 0x3f & uStack_c0);
    psVar17 = (secp256k1_modinv64_signed62 *)
              (lVar11 - ((long)piVar22 * uVar4 + lVar11 & 0x3fffffffffffffff));
    lVar13 = lVar13 + lVar26 + (ulong)CARRY8(uVar21,(ulong)piVar25);
    uVar7 = (long)psVar17 * lVar27;
    lVar11 = SUB168(SEXT816((long)psVar17) * SEXT816(lVar27),8);
    uVar9 = (ulong)(-uVar7 - 1 < uVar4);
    lVar27 = (0x7fffffffffffffff - lVar11) - (long)a_01;
    piVar22 = (int64_t *)((-0x8000000000000000 - lVar11) - (ulong)(uVar7 != 0));
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar11,(long)a_01) != SBORROW8(lVar27,uVar9)) ==
             (long)(lVar27 - uVar9) < 0;
    if (lVar11 < 0) {
      bVar32 = (SBORROW8((long)a_01,(long)piVar22) !=
               SBORROW8((long)a_01 - (long)piVar22,(ulong)(uVar4 < -uVar7))) ==
               (long)(((long)a_01 - (long)piVar22) - (ulong)(uVar4 < -uVar7)) < 0;
    }
    if (!bVar32) goto LAB_00147665;
    lVar27 = (long)a_01 + (ulong)CARRY8(uVar7,uVar4) + lVar11;
    if ((uVar21 + (long)piVar25 & 0x3fffffffffffffff) != 0) goto LAB_0014766a;
    psVar18 = psVar17;
    if ((uVar7 + uVar4 & 0x3fffffffffffffff) != 0) goto LAB_0014766f;
    psVar18 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar9 = (ulong)(uVar21 + (long)piVar25) >> 0x3e | lVar13 * 4;
    psVar10 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar12 = uStack_b0 * (long)piStack_48 + uVar9;
    a_01 = (int64_t *)
           (SUB168(SEXT816((long)uStack_b0) * SEXT816((long)piStack_48),8) + (lVar13 >> 0x3e) +
           (ulong)CARRY8(uStack_b0 * (long)piStack_48,uVar9));
    uVar21 = (long)piStack_a8 * (long)piStack_40;
    lVar14 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)piStack_40),8);
    uVar9 = (ulong)(-uVar21 - 1 < uVar12);
    lVar11 = (0x7fffffffffffffff - lVar14) - (long)a_01;
    lVar26 = (-0x8000000000000000 - lVar14) - (ulong)(uVar21 != 0);
    lVar13 = (long)a_01 - lVar26;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)a_01) != SBORROW8(lVar11,uVar9)) ==
             (long)(lVar11 - uVar9) < 0;
    if (lVar14 < 0) {
      bVar32 = (SBORROW8((long)a_01,lVar26) != SBORROW8(lVar13,(ulong)(uVar12 < -uVar21))) ==
               (long)(lVar13 - (ulong)(uVar12 < -uVar21)) < 0;
    }
    piVar22 = (int64_t *)(ulong)bVar32;
    r = (secp256k1_scalar *)piStack_48;
    piVar31 = piStack_40;
    psStack_a0 = psVar17;
    if (bVar32 == false) goto LAB_00147674;
    uVar9 = uVar7 + uVar4 >> 0x3e | lVar27 * 4;
    uVar7 = uVar12 + uVar21;
    a_01 = (int64_t *)((long)a_01 + (ulong)CARRY8(uVar12,uVar21) + lVar14);
    uVar4 = uStack_c0 * (long)piStack_48 + uVar9;
    lVar14 = SUB168(SEXT816((long)uStack_c0) * SEXT816((long)piStack_48),8) + (lVar27 >> 0x3e) +
             (ulong)CARRY8(uStack_c0 * (long)piStack_48,uVar9);
    uVar21 = (long)piStack_b8 * (long)piStack_40;
    lVar13 = SUB168(SEXT816((long)piStack_b8) * SEXT816((long)piStack_40),8);
    uVar9 = (ulong)(-uVar21 - 1 < uVar4);
    lVar27 = (0x7fffffffffffffff - lVar13) - lVar14;
    lVar26 = (-0x8000000000000000 - lVar13) - (ulong)(uVar21 != 0);
    lVar11 = lVar14 - lVar26;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar14) != SBORROW8(lVar27,uVar9)) ==
             (long)(lVar27 - uVar9) < 0;
    if (lVar13 < 0) {
      bVar32 = (SBORROW8(lVar14,lVar26) != SBORROW8(lVar11,(ulong)(uVar4 < -uVar21))) ==
               (long)(lVar11 - (ulong)(uVar4 < -uVar21)) < 0;
    }
    piVar22 = (int64_t *)(ulong)bVar32;
    if (bVar32 == false) goto LAB_00147679;
    r = (secp256k1_scalar *)0x7fffffffffffffff;
    uVar9 = uVar4 + uVar21;
    lVar11 = lVar14 + lVar13 + (ulong)CARRY8(uVar4,uVar21);
    lVar27 = in_RCX->v[1];
    if (lVar27 != 0) {
      uVar4 = lVar27 * lStack_98;
      lVar14 = SUB168(SEXT816(lVar27) * SEXT816(lStack_98),8);
      uVar21 = (ulong)(-uVar4 - 1 < uVar7);
      lVar13 = (0x7fffffffffffffff - lVar14) - (long)a_01;
      piVar22 = (int64_t *)((-0x8000000000000000 - lVar14) - (ulong)(uVar4 != 0));
      bVar32 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)a_01) != SBORROW8(lVar13,uVar21)) ==
               (long)(lVar13 - uVar21) < 0;
      if (lVar14 < 0) {
        bVar32 = (SBORROW8((long)a_01,(long)piVar22) !=
                 SBORROW8((long)a_01 - (long)piVar22,(ulong)(uVar7 < -uVar4))) ==
                 (long)(((long)a_01 - (long)piVar22) - (ulong)(uVar7 < -uVar4)) < 0;
      }
      psVar10 = psVar17;
      piVar25 = piStack_40;
      if (!bVar32) goto LAB_001476c4;
      uVar12 = lVar27 * (long)psVar17;
      lVar26 = SUB168(SEXT816(lVar27) * SEXT816((long)psVar17),8);
      uVar21 = (ulong)(-uVar12 - 1 < uVar9);
      lVar27 = (0x7fffffffffffffff - lVar26) - lVar11;
      lVar30 = (-0x8000000000000000 - lVar26) - (ulong)(uVar12 != 0);
      lVar13 = lVar11 - lVar30;
      piVar25 = (int64_t *)(lVar13 - (ulong)(uVar9 < -uVar12));
      bVar32 = (SBORROW8(0x7fffffffffffffff - lVar26,lVar11) != SBORROW8(lVar27,uVar21)) ==
               (long)(lVar27 - uVar21) < 0;
      if (lVar26 < 0) {
        bVar32 = (SBORROW8(lVar11,lVar30) != SBORROW8(lVar13,(ulong)(uVar9 < -uVar12))) ==
                 (long)piVar25 < 0;
      }
      piVar22 = (int64_t *)(ulong)bVar32;
      if (bVar32 != false) {
        bVar32 = CARRY8(uVar7,uVar4);
        uVar7 = uVar7 + uVar4;
        a_01 = (int64_t *)((long)a_01 + (ulong)bVar32 + lVar14);
        bVar32 = CARRY8(uVar9,uVar12);
        uVar9 = uVar9 + uVar12;
        lVar11 = lVar11 + lVar26 + (ulong)bVar32;
        goto LAB_00146f98;
      }
      goto LAB_001476c9;
    }
LAB_00146f98:
    uVar21 = (long)a_01 << 2 | uVar7 >> 0x3e;
    uVar12 = uStack_b0 * (long)psStack_58 + uVar21;
    a_01 = (int64_t *)
           (((long)a_01 >> 0x3e) + SUB168(SEXT816((long)uStack_b0) * SEXT816((long)psStack_58),8) +
           (ulong)CARRY8(uStack_b0 * (long)psStack_58,uVar21));
    uVar4 = (long)piStack_a8 * lStack_50;
    lVar14 = SUB168(SEXT816((long)piStack_a8) * SEXT816(lStack_50),8);
    uVar21 = (ulong)(-uVar4 - 1 < uVar12);
    lVar27 = (0x7fffffffffffffff - lVar14) - (long)a_01;
    lVar26 = (-0x8000000000000000 - lVar14) - (ulong)(uVar4 != 0);
    lVar13 = (long)a_01 - lVar26;
    *piStack_88 = uVar7 & 0x3fffffffffffffff;
    *(ulong *)a = uVar9 & 0x3fffffffffffffff;
    bVar32 = (SBORROW8((long)a_01,lVar26) != SBORROW8(lVar13,(ulong)(uVar12 < -uVar4))) ==
             (long)(lVar13 - (ulong)(uVar12 < -uVar4)) < 0;
    piVar22 = (int64_t *)(ulong)bVar32;
    bVar1 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)a_01) != SBORROW8(lVar27,uVar21)) ==
            (long)(lVar27 - uVar21) < 0;
    if (lVar14 < 0) {
      bVar1 = bVar32;
    }
    psVar10 = psStack_58;
    piVar31 = piStack_88;
    if (!bVar1) goto LAB_0014767e;
    uVar9 = uVar9 >> 0x3e | lVar11 << 2;
    uVar23 = uVar12 + uVar4;
    a_01 = (int64_t *)((long)a_01 + (ulong)CARRY8(uVar12,uVar4) + lVar14);
    uVar7 = uStack_c0 * (long)psStack_58 + uVar9;
    lVar13 = SUB168(SEXT816((long)uStack_c0) * SEXT816((long)psStack_58),8) + (lVar11 >> 0x3e) +
             (ulong)CARRY8(uStack_c0 * (long)psStack_58,uVar9);
    uVar21 = (long)piStack_b8 * lStack_50;
    lVar11 = SUB168(SEXT816((long)piStack_b8) * SEXT816(lStack_50),8);
    uVar9 = (ulong)(-uVar21 - 1 < uVar7);
    lVar27 = (0x7fffffffffffffff - lVar11) - lVar13;
    psVar10 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    psVar18 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar11) - (ulong)(uVar21 != 0))
    ;
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar13) != SBORROW8(lVar27,uVar9)) ==
             (long)(lVar27 - uVar9) < 0;
    if (lVar11 < 0) {
      bVar32 = (SBORROW8(lVar13,(long)psVar18) !=
               SBORROW8(lVar13 - (long)psVar18,(ulong)(uVar7 < -uVar21))) ==
               (long)((lVar13 - (long)psVar18) - (ulong)(uVar7 < -uVar21)) < 0;
    }
    piVar22 = (int64_t *)(ulong)bVar32;
    if (bVar32 == false) goto LAB_00147683;
    uVar9 = uVar7 + uVar21;
    lVar11 = lVar13 + lVar11 + (ulong)CARRY8(uVar7,uVar21);
    lVar27 = in_RCX->v[2];
    if (lVar27 != 0) {
      uVar7 = lVar27 * lStack_98;
      lVar14 = SUB168(SEXT816(lVar27) * SEXT816(lStack_98),8);
      uVar21 = (ulong)(-uVar7 - 1 < uVar23);
      lVar13 = (0x7fffffffffffffff - lVar14) - (long)a_01;
      piVar22 = (int64_t *)((-0x8000000000000000 - lVar14) - (ulong)(uVar7 != 0));
      bVar32 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)a_01) != SBORROW8(lVar13,uVar21)) ==
               (long)(lVar13 - uVar21) < 0;
      if (lVar14 < 0) {
        bVar32 = (SBORROW8((long)a_01,(long)piVar22) !=
                 SBORROW8((long)a_01 - (long)piVar22,(ulong)(uVar23 < -uVar7))) ==
                 (long)(((long)a_01 - (long)piVar22) - (ulong)(uVar23 < -uVar7)) < 0;
      }
      piVar25 = piStack_88;
      if (!bVar32) goto LAB_001476ce;
      uVar4 = lVar27 * (long)psVar17;
      lVar26 = SUB168(SEXT816(lVar27) * SEXT816((long)psVar17),8);
      uVar21 = (ulong)(-uVar4 - 1 < uVar9);
      lVar27 = (0x7fffffffffffffff - lVar26) - lVar11;
      lVar30 = (-0x8000000000000000 - lVar26) - (ulong)(uVar4 != 0);
      lVar13 = lVar11 - lVar30;
      piVar25 = (int64_t *)
                (ulong)((SBORROW8(lVar11,lVar30) != SBORROW8(lVar13,(ulong)(uVar9 < -uVar4))) ==
                       (long)(lVar13 - (ulong)(uVar9 < -uVar4)) < 0);
      piVar22 = (int64_t *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar26,lVar11) != SBORROW8(lVar27,uVar21)) ==
                       (long)(lVar27 - uVar21) < 0);
      if (lVar26 < 0) {
        piVar22 = piVar25;
      }
      if ((char)piVar22 != '\0') {
        bVar32 = CARRY8(uVar23,uVar7);
        uVar23 = uVar23 + uVar7;
        a_01 = (int64_t *)((long)a_01 + (ulong)bVar32 + lVar14);
        bVar32 = CARRY8(uVar9,uVar4);
        uVar9 = uVar9 + uVar4;
        lVar11 = lVar11 + lVar26 + (ulong)bVar32;
        goto LAB_00147192;
      }
      goto LAB_001476d3;
    }
LAB_00147192:
    r = (secp256k1_scalar *)0x8000000000000000;
    psVar18 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar21 = (long)a_01 << 2 | uVar23 >> 0x3e;
    uVar4 = uStack_b0 * lStack_78 + uVar21;
    a_01 = (int64_t *)
           (((long)a_01 >> 0x3e) + SUB168(SEXT816((long)uStack_b0) * SEXT816(lStack_78),8) +
           (ulong)CARRY8(uStack_b0 * lStack_78,uVar21));
    uVar7 = (long)piStack_a8 * (long)psStack_60;
    lVar14 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)psStack_60),8);
    uVar21 = (ulong)(-uVar7 - 1 < uVar4);
    lVar27 = (0x7fffffffffffffff - lVar14) - (long)a_01;
    lVar26 = (-0x8000000000000000 - lVar14) - (ulong)(uVar7 != 0);
    lVar13 = (long)a_01 - lVar26;
    piStack_88[1] = uVar23 & 0x3fffffffffffffff;
    *(ulong *)((long)a + 8) = uVar9 & 0x3fffffffffffffff;
    bVar32 = (SBORROW8((long)a_01,lVar26) != SBORROW8(lVar13,(ulong)(uVar4 < -uVar7))) ==
             (long)(lVar13 - (ulong)(uVar4 < -uVar7)) < 0;
    piVar22 = (int64_t *)(ulong)bVar32;
    bVar1 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)a_01) != SBORROW8(lVar27,uVar21)) ==
            (long)(lVar27 - uVar21) < 0;
    if (lVar14 < 0) {
      bVar1 = bVar32;
    }
    psVar10 = psStack_60;
    if (!bVar1) goto LAB_00147688;
    uVar9 = uVar9 >> 0x3e | lVar11 << 2;
    uVar12 = uVar4 + uVar7;
    a_01 = (int64_t *)((long)a_01 + (ulong)CARRY8(uVar4,uVar7) + lVar14);
    uVar7 = uStack_c0 * lStack_78 + uVar9;
    lVar13 = SUB168(SEXT816((long)uStack_c0) * SEXT816(lStack_78),8) + (lVar11 >> 0x3e) +
             (ulong)CARRY8(uStack_c0 * lStack_78,uVar9);
    uVar21 = (long)piStack_b8 * (long)psStack_60;
    lVar11 = SUB168(SEXT816((long)piStack_b8) * SEXT816((long)psStack_60),8);
    uVar9 = (ulong)(-uVar21 - 1 < uVar7);
    lVar27 = (0x7fffffffffffffff - lVar11) - lVar13;
    psVar18 = (secp256k1_modinv64_signed62 *)(lVar27 - uVar9);
    psVar10 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    r = (secp256k1_scalar *)((-0x8000000000000000 - lVar11) - (ulong)(uVar21 != 0));
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar13) != SBORROW8(lVar27,uVar9)) ==
             (long)psVar18 < 0;
    if (lVar11 < 0) {
      bVar32 = (SBORROW8(lVar13,(long)r) != SBORROW8(lVar13 - (long)r,(ulong)(uVar7 < -uVar21))) ==
               (long)((lVar13 - (long)r) - (ulong)(uVar7 < -uVar21)) < 0;
    }
    piVar22 = (int64_t *)(ulong)bVar32;
    if (bVar32 == false) goto LAB_0014768d;
    uVar9 = uVar7 + uVar21;
    lVar11 = lVar13 + lVar11 + (ulong)CARRY8(uVar7,uVar21);
    lVar27 = in_RCX->v[3];
    if (lVar27 == 0) {
LAB_00147375:
      r = (secp256k1_scalar *)0x8000000000000000;
      uVar21 = (long)a_01 << 2 | uVar12 >> 0x3e;
      uVar4 = uStack_b0 * (long)psStack_68 + uVar21;
      a_01 = (int64_t *)
             (((long)a_01 >> 0x3e) + SUB168(SEXT816((long)uStack_b0) * SEXT816((long)psStack_68),8)
             + (ulong)CARRY8(uStack_b0 * (long)psStack_68,uVar21));
      uVar7 = (long)piStack_a8 * (long)psStack_70;
      lVar14 = SUB168(SEXT816((long)piStack_a8) * SEXT816((long)psStack_70),8);
      uVar21 = (ulong)(-uVar7 - 1 < uVar4);
      lVar27 = (0x7fffffffffffffff - lVar14) - (long)a_01;
      lVar26 = (-0x8000000000000000 - lVar14) - (ulong)(uVar7 != 0);
      lVar13 = (long)a_01 - lVar26;
      piStack_88[2] = uVar12 & 0x3fffffffffffffff;
      *(ulong *)((long)a + 0x10) = uVar9 & 0x3fffffffffffffff;
      bVar32 = (SBORROW8((long)a_01,lVar26) != SBORROW8(lVar13,(ulong)(uVar4 < -uVar7))) ==
               (long)(lVar13 - (ulong)(uVar4 < -uVar7)) < 0;
      piVar22 = (int64_t *)(ulong)bVar32;
      bVar1 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)a_01) != SBORROW8(lVar27,uVar21)) ==
              (long)(lVar27 - uVar21) < 0;
      if (lVar14 < 0) {
        bVar1 = bVar32;
      }
      psVar10 = psStack_70;
      psVar18 = psStack_68;
      if (!bVar1) goto LAB_00147692;
      uVar9 = uVar9 >> 0x3e | lVar11 << 2;
      uVar12 = uVar4 + uVar7;
      a_01 = (int64_t *)((long)a_01 + (ulong)CARRY8(uVar4,uVar7) + lVar14);
      uVar7 = uStack_c0 * (long)psStack_68 + uVar9;
      lVar14 = SUB168(SEXT816((long)uStack_c0) * SEXT816((long)psStack_68),8) + (lVar11 >> 0x3e) +
               (ulong)CARRY8(uStack_c0 * (long)psStack_68,uVar9);
      uVar21 = (long)piStack_b8 * (long)psStack_70;
      lVar13 = SUB168(SEXT816((long)piStack_b8) * SEXT816((long)psStack_70),8);
      uVar9 = (ulong)(-uVar21 - 1 < uVar7);
      lVar27 = (0x7fffffffffffffff - lVar13) - lVar14;
      lVar26 = (-0x8000000000000000 - lVar13) - (ulong)(uVar21 != 0);
      lVar11 = lVar14 - lVar26;
      bVar32 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar14) != SBORROW8(lVar27,uVar9)) ==
               (long)(lVar27 - uVar9) < 0;
      if (lVar13 < 0) {
        bVar32 = (SBORROW8(lVar14,lVar26) != SBORROW8(lVar11,(ulong)(uVar7 < -uVar21))) ==
                 (long)(lVar11 - (ulong)(uVar7 < -uVar21)) < 0;
      }
      piVar22 = (int64_t *)(ulong)bVar32;
      if (bVar32 == false) goto LAB_00147697;
      uVar4 = uVar7 + uVar21;
      lVar13 = lVar14 + lVar13 + (ulong)CARRY8(uVar7,uVar21);
      lVar27 = in_RCX->v[4];
      uVar21 = lVar27 * lStack_98;
      piVar22 = SUB168(SEXT816(lVar27) * SEXT816(lStack_98),8);
      uVar9 = (ulong)(-uVar21 - 1 < uVar12);
      lVar11 = (0x7fffffffffffffff - (long)piVar22) - (long)a_01;
      piVar31 = (int64_t *)((-0x8000000000000000 - (long)piVar22) - (ulong)(uVar21 != 0));
      bVar32 = (SBORROW8(0x7fffffffffffffff - (long)piVar22,(long)a_01) != SBORROW8(lVar11,uVar9))
               == (long)(lVar11 - uVar9) < 0;
      if ((long)piVar22 < 0) {
        bVar32 = (SBORROW8((long)a_01,(long)piVar31) !=
                 SBORROW8((long)a_01 - (long)piVar31,(ulong)(uVar12 < -uVar21))) ==
                 (long)(((long)a_01 - (long)piVar31) - (ulong)(uVar12 < -uVar21)) < 0;
      }
      if (!bVar32) goto LAB_0014769c;
      uVar7 = lVar27 * (long)psVar17;
      lVar11 = SUB168(SEXT816(lVar27) * SEXT816((long)psVar17),8);
      psVar18 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
      uVar9 = (ulong)(-uVar7 - 1 < uVar4);
      lVar27 = (0x7fffffffffffffff - lVar11) - lVar13;
      r = (secp256k1_scalar *)((-0x8000000000000000 - lVar11) - (ulong)(uVar7 != 0));
      bVar32 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar13) != SBORROW8(lVar27,uVar9)) ==
               (long)(lVar27 - uVar9) < 0;
      if (lVar11 < 0) {
        bVar32 = (SBORROW8(lVar13,(long)r) != SBORROW8(lVar13 - (long)r,(ulong)(uVar4 < -uVar7))) ==
                 (long)((lVar13 - (long)r) - (ulong)(uVar4 < -uVar7)) < 0;
      }
      psVar10 = (secp256k1_modinv64_signed62 *)(ulong)bVar32;
      if (bVar32 == false) goto LAB_001476a1;
      lVar14 = (long)piVar22 + (long)a_01 + (ulong)CARRY8(uVar21,uVar12);
      lVar27 = lVar11 + lVar13 + (ulong)CARRY8(uVar7,uVar4);
      psVar10 = (secp256k1_modinv64_signed62 *)(lVar14 * 4 | uVar21 + uVar12 >> 0x3e);
      piStack_88[3] = uVar21 + uVar12 & 0x3fffffffffffffff;
      *(ulong *)((long)a + 0x18) = uVar7 + uVar4 & 0x3fffffffffffffff;
      a_01 = psVar10[0x333333333333332].v + 4;
      piVar22 = (int64_t *)
                ((lVar14 >> 0x3e) + -1 +
                (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar10));
      if (piVar22 != (int64_t *)0xffffffffffffffff) goto LAB_001476a6;
      piVar22 = (int64_t *)0xffffffffffffffff;
      uVar9 = uVar7 + uVar4 >> 0x3e | lVar27 * 4;
      piStack_88[4] = (int64_t)psVar10;
      psVar18 = (secp256k1_modinv64_signed62 *)(uVar9 + 0x8000000000000000);
      if ((lVar27 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar9) != -1) goto LAB_001476ab;
      *(ulong *)((long)a + 0x20) = uVar9;
      piVar22 = (int64_t *)0x5;
      psVar10 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_c8 = (int64_t *)0x1475c5;
      a_01 = piStack_88;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piStack_88,5,in_RCX,-2);
      if (iVar2 < 1) goto LAB_001476b0;
      psVar10 = (secp256k1_modinv64_signed62 *)0x1;
      piVar22 = (int64_t *)0x5;
      piStack_c8 = (int64_t *)0x1475e2;
      a_01 = a_03;
      iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_03,5,in_RCX,1);
      if (-1 < iVar2) goto LAB_001476b5;
      piVar22 = (int64_t *)0x5;
      psVar10 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
      piStack_c8 = (int64_t *)0x147601;
      a_01 = a->v;
      iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,-2);
      if (iVar2 < 1) goto LAB_001476ba;
      psVar10 = (secp256k1_modinv64_signed62 *)0x1;
      piVar22 = (int64_t *)0x5;
      piStack_c8 = (int64_t *)0x14761e;
      a_01 = a->v;
      iVar2 = secp256k1_modinv64_mul_cmp_62(a,5,in_RCX,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_001476bf;
    }
    psVar18 = (secp256k1_modinv64_signed62 *)(lVar27 * lStack_98);
    lVar14 = SUB168(SEXT816(lVar27) * SEXT816(lStack_98),8);
    uVar21 = (ulong)(-(long)psVar18 - 1U < uVar12);
    lVar13 = (0x7fffffffffffffff - lVar14) - (long)a_01;
    r = (secp256k1_scalar *)0x8000000000000000;
    piVar22 = (int64_t *)
              ((-0x8000000000000000 - lVar14) -
              (ulong)(psVar18 != (secp256k1_modinv64_signed62 *)0x0));
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar14,(long)a_01) != SBORROW8(lVar13,uVar21)) ==
             (long)(lVar13 - uVar21) < 0;
    if (lVar14 < 0) {
      bVar32 = (SBORROW8((long)a_01,(long)piVar22) !=
               SBORROW8((long)a_01 - (long)piVar22,(ulong)(uVar12 < (ulong)-(long)psVar18))) ==
               (long)(((long)a_01 - (long)piVar22) - (ulong)(uVar12 < (ulong)-(long)psVar18)) < 0;
    }
    piVar25 = piStack_88;
    if (!bVar32) goto LAB_001476d8;
    uVar7 = lVar27 * (long)psVar17;
    lVar26 = SUB168(SEXT816(lVar27) * SEXT816((long)psVar17),8);
    uVar21 = (ulong)(-uVar7 - 1 < uVar9);
    lVar27 = (0x7fffffffffffffff - lVar26) - lVar11;
    lVar30 = (-0x8000000000000000 - lVar26) - (ulong)(uVar7 != 0);
    lVar13 = lVar11 - lVar30;
    piVar25 = (int64_t *)(lVar13 - (ulong)(uVar9 < -uVar7));
    bVar32 = (SBORROW8(0x7fffffffffffffff - lVar26,lVar11) != SBORROW8(lVar27,uVar21)) ==
             (long)(lVar27 - uVar21) < 0;
    if (lVar26 < 0) {
      bVar32 = (SBORROW8(lVar11,lVar30) != SBORROW8(lVar13,(ulong)(uVar9 < -uVar7))) ==
               (long)piVar25 < 0;
    }
    uVar3 = (uint)bVar32;
    if (bVar32 != false) {
      bVar32 = CARRY8(uVar12,(ulong)psVar18);
      uVar12 = (long)psVar18->v + uVar12;
      a_01 = (int64_t *)((long)a_01 + (ulong)bVar32 + lVar14);
      bVar32 = CARRY8(uVar9,uVar7);
      uVar9 = uVar9 + uVar7;
      lVar11 = lVar11 + lVar26 + (ulong)bVar32;
      goto LAB_00147375;
    }
  }
  piStack_c8 = (int64_t *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  a_02 = &sStack_128;
  psStack_d8 = psVar18;
  piStack_d0 = (int64_t *)r;
  piStack_c8 = piVar25;
  secp256k1_modinv64_mul_62(&sStack_100,(secp256k1_modinv64_signed62 *)a_01,uVar3,1);
  psVar10 = a_00;
  secp256k1_modinv64_mul_62(&sStack_128,a_00,5,(int64_t)psVar17);
  lVar27 = 0;
  while ((ulong)sStack_100.v[lVar27] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_128.v[lVar27]) goto LAB_00147772;
    lVar27 = lVar27 + 1;
    if (lVar27 == 4) {
      uVar3 = 4;
      while( true ) {
        if (sStack_100.v[uVar3] < sStack_128.v[uVar3]) {
          return;
        }
        if (sStack_128.v[uVar3] < sStack_100.v[uVar3]) break;
        bVar32 = uVar3 == 0;
        uVar3 = uVar3 - 1;
        if (bVar32) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00147772:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar2 = (int)a_02;
  if (iVar2 < 1) {
LAB_00147a31:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00147a36:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00147a3b:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00147a40:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_00147a45:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00147a4a:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar27 = psVar17->v[0];
    lVar11 = psVar17->v[1];
    lVar13 = psVar10->v[0];
    lVar14 = *extraout_RDX_00;
    uVar9 = lVar13 * lVar27;
    lVar30 = SUB168(SEXT816(lVar13) * SEXT816(lVar27),8);
    uVar21 = lVar14 * lVar11;
    lVar15 = SUB168(SEXT816(lVar14) * SEXT816(lVar11),8);
    lVar26 = (0x7fffffffffffffff - lVar15) - lVar30;
    if (-1 < lVar15 &&
        (SBORROW8(0x7fffffffffffffff - lVar15,lVar30) != SBORROW8(lVar26,(ulong)(~uVar21 < uVar9)))
        != (long)(lVar26 - (ulong)(~uVar21 < uVar9)) < 0) goto LAB_00147a36;
    lVar26 = psVar17->v[2];
    lVar24 = lVar15 + lVar30 + (ulong)CARRY8(uVar21,uVar9);
    lVar30 = psVar17->v[3];
    uVar4 = lVar13 * lVar26;
    lVar15 = SUB168(SEXT816(lVar13) * SEXT816(lVar26),8);
    uVar12 = lVar14 * lVar30;
    lVar14 = SUB168(SEXT816(lVar14) * SEXT816(lVar30),8);
    uVar7 = (ulong)(-uVar12 - 1 < uVar4);
    lVar13 = (0x7fffffffffffffff - lVar14) - lVar15;
    if (-1 < lVar14 &&
        (SBORROW8(0x7fffffffffffffff - lVar14,lVar15) != SBORROW8(lVar13,uVar7)) !=
        (long)(lVar13 - uVar7) < 0) goto LAB_00147a3b;
    lVar13 = lVar14 + lVar15 + (ulong)CARRY8(uVar12,uVar4);
    if ((uVar21 + uVar9 & 0x3fffffffffffffff) != 0) goto LAB_00147a40;
    if ((uVar12 + uVar4 & 0x3fffffffffffffff) != 0) goto LAB_00147a45;
    uVar7 = uVar12 + uVar4 >> 0x3e | lVar13 * 4;
    uVar9 = uVar21 + uVar9 >> 0x3e | lVar24 * 4;
    lVar13 = lVar13 >> 0x3e;
    lVar24 = lVar24 >> 0x3e;
    if (iVar2 != 1) {
      psVar17 = (secp256k1_modinv64_signed62 *)((ulong)a_02 & 0xffffffff);
      a_02 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar14 = psVar10->v[(long)a_02];
        uVar4 = lVar14 * lVar27 + uVar9;
        lVar19 = SUB168(SEXT816(lVar14) * SEXT816(lVar27),8) + lVar24 +
                 (ulong)CARRY8(lVar14 * lVar27,uVar9);
        lVar15 = extraout_RDX_00[(long)a_02];
        uVar21 = lVar15 * lVar11;
        lVar16 = SUB168(SEXT816(lVar15) * SEXT816(lVar11),8);
        uVar9 = (ulong)(-uVar21 - 1 < uVar4);
        lVar24 = (0x7fffffffffffffff - lVar16) - lVar19;
        psVar18 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar28 = (-0x8000000000000000 - lVar16) - (ulong)(uVar21 != 0);
        lVar29 = lVar19 - lVar28;
        bVar32 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar19) != SBORROW8(lVar24,uVar9)) ==
                 (long)(lVar24 - uVar9) < 0;
        if (lVar16 < 0) {
          bVar32 = (SBORROW8(lVar19,lVar28) != SBORROW8(lVar29,(ulong)(uVar4 < -uVar21))) ==
                   (long)(lVar29 - (ulong)(uVar4 < -uVar21)) < 0;
        }
        if (!bVar32) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00147a2c:
          psVar10 = psVar18;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_00147a31;
        }
        uVar23 = lVar14 * lVar26 + uVar7;
        lVar29 = SUB168(SEXT816(lVar14) * SEXT816(lVar26),8) + lVar13 +
                 (ulong)CARRY8(lVar14 * lVar26,uVar7);
        uVar12 = lVar15 * lVar30;
        lVar15 = SUB168(SEXT816(lVar15) * SEXT816(lVar30),8);
        uVar9 = (ulong)(-uVar12 - 1 < uVar23);
        lVar13 = (0x7fffffffffffffff - lVar15) - lVar29;
        lVar24 = (-0x8000000000000000 - lVar15) - (ulong)(uVar12 != 0);
        lVar14 = lVar29 - lVar24;
        bVar32 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar29) != SBORROW8(lVar13,uVar9)) ==
                 (long)(lVar13 - uVar9) < 0;
        if (lVar15 < 0) {
          bVar32 = (SBORROW8(lVar29,lVar24) != SBORROW8(lVar14,(ulong)(uVar23 < -uVar12))) ==
                   (long)(lVar14 - (ulong)(uVar23 < -uVar12)) < 0;
        }
        if (!bVar32) goto LAB_00147a2c;
        lVar24 = lVar16 + lVar19 + (ulong)CARRY8(uVar21,uVar4);
        lVar13 = lVar15 + lVar29 + (ulong)CARRY8(uVar12,uVar23);
        uVar9 = lVar24 * 4 | uVar21 + uVar4 >> 0x3e;
        psVar10->v[(long)((long)a_02[-1].v + 0x27)] = uVar21 + uVar4 & 0x3fffffffffffffff;
        uVar7 = lVar13 * 4 | uVar12 + uVar23 >> 0x3e;
        extraout_RDX_00[(long)((long)a_02[-1].v + 0x27)] = uVar12 + uVar23 & 0x3fffffffffffffff;
        a_02 = (secp256k1_modinv64_signed62 *)((long)a_02->v + 1);
        lVar13 = lVar13 >> 0x3e;
        lVar24 = lVar24 >> 0x3e;
      } while (psVar17 != a_02);
    }
    if (lVar24 + -1 + (ulong)(0x7fffffffffffffff < uVar9) != -1) goto LAB_00147a4a;
    psVar10->v[(long)iVar2 + -1] = uVar9;
    if (lVar13 + -1 + (ulong)(0x7fffffffffffffff < uVar7) == -1) {
      extraout_RDX_00[(long)iVar2 + -1] = uVar7;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar27 = a_02->v[0];
  lVar11 = a_02->v[1];
  lVar13 = a_02->v[2];
  lVar14 = a_02->v[3];
  lVar26 = a_02->v[4];
  lVar30 = 0;
  do {
    if (a_02->v[lVar30] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00147c80:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00147c85;
    }
    if (0x3fffffffffffffff < a_02->v[lVar30]) goto LAB_00147c80;
    lVar30 = lVar30 + 1;
  } while (lVar30 != 5);
  iVar2 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,-2);
  if (iVar2 < 1) {
LAB_00147c85:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_00147c8a:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00147c8f:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar2 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
    if (-1 < iVar2) goto LAB_00147c8a;
    uVar9 = lVar26 >> 0x3f;
    uVar4 = (long)psVar10 >> 0x3f;
    uVar21 = ((uVar9 & b->v[0]) + lVar27 ^ uVar4) - uVar4;
    uVar12 = ((long)uVar21 >> 0x3e) + (((uVar9 & b->v[1]) + lVar11 ^ uVar4) - uVar4);
    uVar23 = ((long)uVar12 >> 0x3e) + ((lVar13 + (uVar9 & b->v[2]) ^ uVar4) - uVar4);
    uVar7 = ((long)uVar23 >> 0x3e) + (((uVar9 & b->v[3]) + lVar14 ^ uVar4) - uVar4);
    lVar27 = ((long)uVar7 >> 0x3e) + (((uVar9 & b->v[4]) + lVar26 ^ uVar4) - uVar4);
    uVar4 = lVar27 >> 0x3f;
    uVar9 = (b->v[0] & uVar4) + (uVar21 & 0x3fffffffffffffff);
    uVar12 = ((long)uVar9 >> 0x3e) + (b->v[1] & uVar4) + (uVar12 & 0x3fffffffffffffff);
    uVar21 = ((long)uVar12 >> 0x3e) + (b->v[2] & uVar4) + (uVar23 & 0x3fffffffffffffff);
    uVar7 = ((long)uVar21 >> 0x3e) + (b->v[3] & uVar4) + (uVar7 & 0x3fffffffffffffff);
    uVar4 = (b->v[4] & uVar4) + lVar27 + ((long)uVar7 >> 0x3e);
    a_02->v[0] = uVar9 & 0x3fffffffffffffff;
    a_02->v[1] = uVar12 & 0x3fffffffffffffff;
    a_02->v[2] = uVar21 & 0x3fffffffffffffff;
    a_02->v[3] = uVar7 & 0x3fffffffffffffff;
    a_02->v[4] = uVar4;
    if (0x3fffffffffffffff < uVar4) goto LAB_00147c8f;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,0);
    if (-1 < iVar2) {
      iVar2 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
      if (iVar2 < 0) {
        return;
      }
      goto LAB_00147c99;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00147c99:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_from_signed62(secp256k1_scalar *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->d[0] = a0      | a1 << 62;
    r->d[1] = a1 >> 2 | a2 << 60;
    r->d[2] = a2 >> 4 | a3 << 58;
    r->d[3] = a3 >> 6 | a4 << 56;

#ifdef VERIFY
    VERIFY_CHECK(secp256k1_scalar_check_overflow(r) == 0);
#endif
}